

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void __thiscall io::detail::AsynchronousReader::~AsynchronousReader(AsynchronousReader *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> guard;
  AsynchronousReader *this_local;
  
  guard._8_8_ = this;
  bVar1 = std::operator!=(&this->byte_source,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->lock);
    this->termination_requested = true;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->read_requested_condition);
  std::condition_variable::~condition_variable(&this->read_finished_condition);
  std::__exception_ptr::exception_ptr::~exception_ptr(&this->read_error);
  std::thread::~thread(&this->worker);
  std::unique_ptr<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>::~unique_ptr
            (&this->byte_source);
  return;
}

Assistant:

~AsynchronousReader(){
                                if(byte_source != nullptr){
                                        {
                                                std::unique_lock<std::mutex>guard(lock);
                                                termination_requested = true;
                                        }
                                        read_requested_condition.notify_one();
                                        worker.join();
                                }
                        }